

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef
CompileArgument(LlvmCompilationContext *ctx,TypeBase *argumentType,LLVMValueRef argument)

{
  LLVMBuilderRef pLVar1;
  bool bVar2;
  LLVMTypeRef pLVar3;
  LLVMValueRef storage;
  LLVMValueRef argument_local;
  TypeBase *argumentType_local;
  LlvmCompilationContext *ctx_local;
  
  bVar2 = IsStructArgumentType(argumentType);
  ctx_local = (LlvmCompilationContext *)argument;
  if (bVar2) {
    pLVar1 = ctx->builder;
    pLVar3 = CompileLlvmType(ctx,argumentType);
    ctx_local = (LlvmCompilationContext *)LLVMBuildAlloca(pLVar1,pLVar3,"");
    LLVMSetAlignment((LLVMValueRef)ctx_local,0x10);
    LLVMBuildStore(ctx->builder,argument,(LLVMValueRef)ctx_local);
  }
  return (LLVMValueRef)ctx_local;
}

Assistant:

LLVMValueRef CompileArgument(LlvmCompilationContext& ctx, TypeBase *argumentType, LLVMValueRef argument)
{
	if (IsStructArgumentType(argumentType))
	{
		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, argumentType), "");

		LLVMSetAlignment(storage, 16);

		LLVMBuildStore(ctx.builder, argument, storage);

		return storage;
	}

	return argument;
}